

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitArrayNewData(BinaryInstWriter *this,ArrayNewData *curr)

{
  WasmBinaryWriter *this_00;
  BufferWithRandomAccess *pBVar1;
  HeapType type;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  LEB<unsigned_int,_unsigned_char> local_2c;
  LEB<unsigned_int,_unsigned_char> local_28;
  uchar local_21;
  
  local_21 = 0xfb;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (&this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_21);
  local_28.value = 9;
  LEB<unsigned_int,_unsigned_char>::write(&local_28,(int)this->o,__buf,in_RCX);
  this_00 = this->parent;
  type = wasm::Type::getHeapType
                   (&(curr->super_SpecificExpression<(wasm::Expression::Id)71>).super_Expression.
                     type);
  WasmBinaryWriter::writeIndexedHeapType(this_00,type);
  pBVar1 = this->o;
  local_2c.value =
       WasmBinaryWriter::getDataSegmentIndex(this->parent,(Name)(curr->segment).super_IString.str);
  LEB<unsigned_int,_unsigned_char>::write(&local_2c,(int)pBVar1,__buf_00,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitArrayNewData(ArrayNewData* curr) {
  o << int8_t(BinaryConsts::GCPrefix);
  o << U32LEB(BinaryConsts::ArrayNewData);
  parent.writeIndexedHeapType(curr->type.getHeapType());
  o << U32LEB(parent.getDataSegmentIndex(curr->segment));
}